

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O2

TInfoSinkBase * __thiscall glslang::TInfoSinkBase::operator<<(TInfoSinkBase *this,int n)

{
  int in_ECX;
  undefined4 in_register_00000034;
  TString TStack_38;
  
  String_abi_cxx11_(&TStack_38,(glslang *)CONCAT44(in_register_00000034,n),10,in_ECX);
  append(this,&TStack_38);
  return this;
}

Assistant:

TInfoSinkBase& operator<<(int n)                   { append(String(n)); return *this; }